

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int delmatchlines(int f,int n)

{
  int s;
  int n_local;
  int f_local;
  
  n_local = re_readpattern("Flush lines (containing match for regexp)");
  if (n_local == 1) {
    n_local = killmatches(1);
  }
  return n_local;
}

Assistant:

int
delmatchlines(int f, int n)
{
	int	s;

	if ((s = re_readpattern("Flush lines (containing match for regexp)"))
	    != TRUE)
		return (s);

	s = killmatches(TRUE);
	return (s);
}